

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O0

void av1_fwd_txfm2d_4x16_sse4_1(int16_t *input,int32_t *coeff,int stride,TX_TYPE tx_type,int bd)

{
  byte in_CL;
  __m128i *in_RSI;
  __m128i tmp [4];
  int i;
  int lr_flip;
  int ud_flip;
  fwd_transform_1d_sse4_1 row_txfm;
  fwd_transform_1d_sse4_1 col_txfm;
  int bitrow;
  int bitcol;
  int txfm_size_row;
  int txfm_size_col;
  int txh_idx;
  int txw_idx;
  int8_t *shift;
  __m128i *outcoeff128;
  __m128i in [16];
  longlong alStackY_1b8 [2];
  int in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  int in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  __m128i *in_stack_fffffffffffffe68;
  int16_t *in_stack_fffffffffffffe70;
  int local_16c;
  int local_168;
  int local_164;
  fwd_transform_1d_sse4_1 local_160;
  fwd_transform_1d_sse4_1 local_158;
  int local_150;
  int local_14c;
  undefined4 local_148;
  undefined4 local_144;
  int local_140;
  int local_13c;
  int8_t *local_138;
  __m128i *local_130;
  longlong local_128 [34];
  byte local_15;
  __m128i *local_10;
  
  local_138 = av1_fwd_txfm_shift_ls[0xd];
  local_130 = in_RSI;
  local_15 = in_CL;
  local_10 = in_RSI;
  local_13c = get_txw_idx('\r');
  local_140 = get_txh_idx('\r');
  local_144 = 4;
  local_148 = 0x10;
  local_14c = (int)av1_fwd_cos_bit_col[local_13c][local_140];
  local_150 = (int)av1_fwd_cos_bit_row[local_13c][local_140];
  local_158 = col_highbd_txfm8x16_arr[local_15];
  local_160 = row_highbd_txfm4x4_arr[local_15];
  get_flip_cfg(local_15,&local_164,&local_168);
  load_buffer_4x16(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe64,
                   in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58);
  (*local_158)((__m128i *)local_128,local_130,local_14c,1);
  col_txfm_8x8_rounding(local_130,-(int)local_138[1]);
  transpose_8nx8n(local_130,(__m128i *)local_128,4,0x10);
  for (local_16c = 0; local_16c < 4; local_16c = local_16c + 1) {
    (*local_160)((__m128i *)(local_128 + (long)local_16c * 2),&alStackY_1b8,local_150,4);
    store_output_w4((int32_t *)((long)*local_10 + (long)(local_16c << 2) * 4),&alStackY_1b8,0x10,4);
  }
  return;
}

Assistant:

void av1_fwd_txfm2d_4x16_sse4_1(const int16_t *input, int32_t *coeff,
                                int stride, TX_TYPE tx_type, int bd) {
  __m128i in[16];
  __m128i *outcoeff128 = (__m128i *)coeff;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_4X16];
  const int txw_idx = get_txw_idx(TX_4X16);
  const int txh_idx = get_txh_idx(TX_4X16);
  const int txfm_size_col = tx_size_wide[TX_4X16];
  const int txfm_size_row = tx_size_high[TX_4X16];
  int bitcol = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  int bitrow = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const fwd_transform_1d_sse4_1 col_txfm = col_highbd_txfm8x16_arr[tx_type];
  const fwd_transform_1d_sse4_1 row_txfm = row_highbd_txfm4x4_arr[tx_type];

  int ud_flip, lr_flip;
  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  // col transform
  load_buffer_4x16(input, in, stride, ud_flip, lr_flip, shift[0]);
  col_txfm(in, outcoeff128, bitcol, 1);
  col_txfm_8x8_rounding(outcoeff128, -shift[1]);
  transpose_8nx8n(outcoeff128, in, txfm_size_col, txfm_size_row);

  // row transform
  for (int i = 0; i < 4; i++) {
    __m128i tmp[4];
    row_txfm(in + i, tmp, bitrow, txfm_size_row >> 2);
    store_output_w4(coeff + i * 4, tmp, txfm_size_row, txfm_size_col);
  }
  (void)bd;
}